

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int iVar1;
  GLFWmonitor *pGVar2;
  GLFWvidmode *pGVar3;
  char *pcVar4;
  GLFWvidmode *mode;
  GLFWmonitor *monitor;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  glfwGetTime();
  pcVar4 = "released";
  if (action == 1) {
    pcVar4 = "pressed";
  }
  printf("%0.2f Key %s\n",pcVar4);
  if (action == 1) {
    if (key == 0x41) {
      iVar1 = glfwGetWindowAttrib(window,0x20006);
      glfwSetWindowAttrib(window,0x20006,(uint)((iVar1 != 0 ^ 0xffU) & 1));
    }
    else if (key == 0x42) {
      iVar1 = glfwGetWindowAttrib(window,0x20003);
      glfwSetWindowAttrib(window,0x20003,(uint)((iVar1 != 0 ^ 0xffU) & 1));
    }
    else if (key == 0x44) {
      iVar1 = glfwGetWindowAttrib(window,0x20005);
      glfwSetWindowAttrib(window,0x20005,(uint)((iVar1 != 0 ^ 0xffU) & 1));
    }
    else if (key == 0x46) {
      iVar1 = glfwGetWindowAttrib(window,0x20007);
      glfwSetWindowAttrib(window,0x20007,(uint)((iVar1 != 0 ^ 0xffU) & 1));
    }
    else if (key == 0x49) {
      glfwIconifyWindow(window);
    }
    else if (key == 0x4d) {
      glfwMaximizeWindow(window);
    }
    else if (key == 0x52) {
      glfwRestoreWindow(window);
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
    }
    else if (((key == 0x101) || (key == 300)) && (mods == 4)) {
      pGVar2 = glfwGetWindowMonitor(window);
      if (pGVar2 == (GLFWmonitor *)0x0) {
        pGVar2 = glfwGetPrimaryMonitor();
        if (pGVar2 != (GLFWmonitor *)0x0) {
          pGVar3 = glfwGetVideoMode(pGVar2);
          glfwGetWindowPos(window,&windowed_xpos,&windowed_ypos);
          glfwGetWindowSize(window,&windowed_width,&windowed_height);
          glfwSetWindowMonitor(window,pGVar2,0,0,pGVar3->width,pGVar3->height,pGVar3->refreshRate);
        }
      }
      else {
        glfwSetWindowMonitor
                  (window,(GLFWmonitor *)0x0,windowed_xpos,windowed_ypos,windowed_width,
                   windowed_height,0);
      }
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    printf("%0.2f Key %s\n",
           glfwGetTime(),
           action == GLFW_PRESS ? "pressed" : "released");

    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_I:
            glfwIconifyWindow(window);
            break;
        case GLFW_KEY_M:
            glfwMaximizeWindow(window);
            break;
        case GLFW_KEY_R:
            glfwRestoreWindow(window);
            break;
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;
        case GLFW_KEY_A:
            glfwSetWindowAttrib(window, GLFW_AUTO_ICONIFY, !glfwGetWindowAttrib(window, GLFW_AUTO_ICONIFY));
            break;
        case GLFW_KEY_B:
            glfwSetWindowAttrib(window, GLFW_RESIZABLE, !glfwGetWindowAttrib(window, GLFW_RESIZABLE));
            break;
        case GLFW_KEY_D:
            glfwSetWindowAttrib(window, GLFW_DECORATED, !glfwGetWindowAttrib(window, GLFW_DECORATED));
            break;
        case GLFW_KEY_F:
            glfwSetWindowAttrib(window, GLFW_FLOATING, !glfwGetWindowAttrib(window, GLFW_FLOATING));
            break;
        case GLFW_KEY_F11:
        case GLFW_KEY_ENTER:
        {
            if (mods != GLFW_MOD_ALT)
                return;

            if (glfwGetWindowMonitor(window))
            {
                glfwSetWindowMonitor(window, NULL,
                                     windowed_xpos, windowed_ypos,
                                     windowed_width, windowed_height,
                                     0);
            }
            else
            {
                GLFWmonitor* monitor = glfwGetPrimaryMonitor();
                if (monitor)
                {
                    const GLFWvidmode* mode = glfwGetVideoMode(monitor);
                    glfwGetWindowPos(window, &windowed_xpos, &windowed_ypos);
                    glfwGetWindowSize(window, &windowed_width, &windowed_height);
                    glfwSetWindowMonitor(window, monitor,
                                         0, 0, mode->width, mode->height,
                                         mode->refreshRate);
                }
            }

            break;
        }
    }
}